

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marginal.cc
# Opt level: O3

base_learner * marginal_setup(options_i *options,vw *all)

{
  int iVar1;
  typed_option<float> *ptVar2;
  long lVar3;
  base_learner *l;
  single_learner *base;
  learner<MARGINAL::data,_example> *plVar4;
  size_t u;
  long lVar5;
  option_group_definition marginal_options;
  string marginal;
  code *local_6b8;
  data *local_6b0;
  undefined1 *local_6a8 [2];
  undefined1 local_698 [16];
  undefined1 local_688 [112];
  bool local_618;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_600;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_5f0;
  option_group_definition local_5e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5b0;
  undefined1 *local_590;
  long local_588;
  undefined1 local_580 [16];
  string local_570;
  string local_550;
  string local_530;
  string local_510;
  string local_4f0;
  string local_4d0;
  string local_4b0;
  typed_option<float> local_490;
  typed_option<bool> local_3f0;
  typed_option<bool> local_350;
  typed_option<bool> local_2b0;
  typed_option<float> local_210;
  typed_option<float> local_170;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d0;
  
  scoped_calloc_or_throw<MARGINAL::data>();
  local_5b0._M_dataplus._M_p = (pointer)&local_5b0.field_2;
  local_5b0._M_string_length = 0;
  local_5b0.field_2._M_local_buf[0] = '\0';
  local_590 = local_580;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_590,"VW options","");
  local_5e8.m_name._M_dataplus._M_p = (pointer)&local_5e8.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_5e8,local_590,local_590 + local_588);
  local_5e8.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_5e8.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_5e8.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_590 != local_580) {
    operator_delete(local_590);
  }
  local_4b0._M_dataplus._M_p = (pointer)&local_4b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b0,"marginal","");
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_688,&local_4b0,&local_5b0);
  local_618 = true;
  local_6a8[0] = local_698;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_6a8,"substitute marginal label estimates for ids","");
  std::__cxx11::string::_M_assign((string *)(local_688 + 0x30));
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_d0,
               (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_688);
  VW::config::option_group_definition::add<std::__cxx11::string>(&local_5e8,&local_d0);
  local_d0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cd158;
  if (local_d0.m_default_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_default_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_d0.m_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_d0.super_base_option);
  if (local_6a8[0] != local_698) {
    operator_delete(local_6a8[0]);
  }
  local_688._0_8_ = &PTR__typed_option_002cd158;
  if (local_5f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_5f0._M_pi);
  }
  if (local_600._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_600._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_688);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
    operator_delete(local_4b0._M_dataplus._M_p);
  }
  local_4d0._M_dataplus._M_p = (pointer)&local_4d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4d0,"initial_denominator","");
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)local_688,&local_4d0,&local_6b0->initial_denominator);
  ptVar2 = VW::config::typed_option<float>::default_value((typed_option<float> *)local_688,1.0);
  local_6a8[0] = local_698;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6a8,"initial denominator","");
  std::__cxx11::string::_M_assign((string *)&(ptVar2->super_base_option).m_help);
  VW::config::typed_option<float>::typed_option(&local_170,ptVar2);
  VW::config::option_group_definition::add<float>(&local_5e8,&local_170);
  local_170.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cd238;
  if (local_170.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_170.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_170.super_base_option);
  if (local_6a8[0] != local_698) {
    operator_delete(local_6a8[0]);
  }
  local_688._0_8_ = &PTR__typed_option_002cd238;
  if (local_5f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_5f0._M_pi);
  }
  if (local_600._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_600._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_688);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
    operator_delete(local_4d0._M_dataplus._M_p);
  }
  local_4f0._M_dataplus._M_p = (pointer)&local_4f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4f0,"initial_numerator","");
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)local_688,&local_4f0,&local_6b0->initial_numerator);
  ptVar2 = VW::config::typed_option<float>::default_value((typed_option<float> *)local_688,0.5);
  local_6a8[0] = local_698;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6a8,"initial numerator","");
  std::__cxx11::string::_M_assign((string *)&(ptVar2->super_base_option).m_help);
  VW::config::typed_option<float>::typed_option(&local_210,ptVar2);
  VW::config::option_group_definition::add<float>(&local_5e8,&local_210);
  local_210.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cd238;
  if (local_210.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_210.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_210.super_base_option);
  if (local_6a8[0] != local_698) {
    operator_delete(local_6a8[0]);
  }
  local_688._0_8_ = &PTR__typed_option_002cd238;
  if (local_5f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_5f0._M_pi);
  }
  if (local_600._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_600._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_688);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
    operator_delete(local_4f0._M_dataplus._M_p);
  }
  local_510._M_dataplus._M_p = (pointer)&local_510.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_510,"compete","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_688,&local_510,&local_6b0->compete);
  local_6a8[0] = local_698;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_6a8,"enable competition with marginal features","");
  std::__cxx11::string::_M_assign((string *)(local_688 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_2b0,(typed_option<bool> *)local_688);
  VW::config::option_group_definition::add<bool>(&local_5e8,&local_2b0);
  local_2b0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cd0f0;
  if (local_2b0.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b0.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_2b0.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b0.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_2b0.super_base_option);
  if (local_6a8[0] != local_698) {
    operator_delete(local_6a8[0]);
  }
  local_688._0_8_ = &PTR__typed_option_002cd0f0;
  if (local_5f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_5f0._M_pi);
  }
  if (local_600._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_600._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_688);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_510._M_dataplus._M_p != &local_510.field_2) {
    operator_delete(local_510._M_dataplus._M_p);
  }
  local_530._M_dataplus._M_p = (pointer)&local_530.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_530,"update_before_learn","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_688,&local_530,&local_6b0->update_before_learn);
  local_6a8[0] = local_698;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_6a8,"update marginal values before learning","");
  std::__cxx11::string::_M_assign((string *)(local_688 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_350,(typed_option<bool> *)local_688);
  VW::config::option_group_definition::add<bool>(&local_5e8,&local_350);
  local_350.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cd0f0;
  if (local_350.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_350.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_350.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_350.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_350.super_base_option);
  if (local_6a8[0] != local_698) {
    operator_delete(local_6a8[0]);
  }
  local_688._0_8_ = &PTR__typed_option_002cd0f0;
  if (local_5f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_5f0._M_pi);
  }
  if (local_600._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_600._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_688);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_530._M_dataplus._M_p != &local_530.field_2) {
    operator_delete(local_530._M_dataplus._M_p);
  }
  local_550._M_dataplus._M_p = (pointer)&local_550.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_550,"unweighted_marginals","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_688,&local_550,&local_6b0->unweighted_marginals);
  local_6a8[0] = local_698;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_6a8,"ignore importance weights when computing marginals","");
  std::__cxx11::string::_M_assign((string *)(local_688 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_3f0,(typed_option<bool> *)local_688);
  VW::config::option_group_definition::add<bool>(&local_5e8,&local_3f0);
  local_3f0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cd0f0;
  if (local_3f0.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3f0.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_3f0.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3f0.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_3f0.super_base_option);
  if (local_6a8[0] != local_698) {
    operator_delete(local_6a8[0]);
  }
  local_688._0_8_ = &PTR__typed_option_002cd0f0;
  if (local_5f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_5f0._M_pi);
  }
  if (local_600._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_600._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_688);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_550._M_dataplus._M_p != &local_550.field_2) {
    operator_delete(local_550._M_dataplus._M_p);
  }
  local_570._M_dataplus._M_p = (pointer)&local_570.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_570,"decay","");
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)local_688,&local_570,&local_6b0->decay);
  ptVar2 = VW::config::typed_option<float>::default_value((typed_option<float> *)local_688,0.0);
  local_6a8[0] = local_698;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_6a8,"decay multiplier per event (1e-3 for example)","");
  std::__cxx11::string::_M_assign((string *)&(ptVar2->super_base_option).m_help);
  VW::config::typed_option<float>::typed_option(&local_490,ptVar2);
  VW::config::option_group_definition::add<float>(&local_5e8,&local_490);
  local_490.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cd238;
  if (local_490.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_490.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_490.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_490.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_490.super_base_option);
  if (local_6a8[0] != local_698) {
    operator_delete(local_6a8[0]);
  }
  local_688._0_8_ = &PTR__typed_option_002cd238;
  if (local_5f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_5f0._M_pi);
  }
  if (local_600._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_600._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_688);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_570._M_dataplus._M_p != &local_570.field_2) {
    operator_delete(local_570._M_dataplus._M_p);
  }
  (**options->_vptr_options_i)(options,&local_5e8);
  local_688._0_8_ = local_688 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_688,"marginal","");
  iVar1 = (*options->_vptr_options_i[1])(options,local_688);
  if ((undefined1 *)local_688._0_8_ != local_688 + 0x10) {
    operator_delete((void *)local_688._0_8_);
  }
  if ((char)iVar1 == '\0') {
    plVar4 = (learner<MARGINAL::data,_example> *)0x0;
  }
  else {
    local_6b0->all = all;
    lVar5 = 0;
    do {
      lVar3 = std::__cxx11::string::find((char)&local_5b0,(ulong)(uint)(int)(char)lVar5);
      if (lVar3 != -1) {
        local_6b0->id_features[lVar5] = true;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x100);
    l = setup_base(options,all);
    base = LEARNER::as_singleline<char,char>(l);
    plVar4 = LEARNER::learner<MARGINAL::data,example>::init_learner<LEARNER::learner<char,example>>
                       (local_6b0,base,MARGINAL::predict_or_learn<true>,
                        MARGINAL::predict_or_learn<false>,1,*(prediction_type_t *)(base + 0xd0));
    local_6b0 = (data *)0x0;
    *(undefined8 *)(plVar4 + 0xb8) = *(undefined8 *)(plVar4 + 0x18);
    *(undefined8 *)(plVar4 + 0xc0) = *(undefined8 *)(plVar4 + 0x20);
    *(code **)(plVar4 + 200) = MARGINAL::finish;
    *(code **)(plVar4 + 0x80) = MARGINAL::save_load;
    *(undefined8 *)(plVar4 + 0x70) = *(undefined8 *)(plVar4 + 0x18);
    *(undefined8 *)(plVar4 + 0x78) = *(undefined8 *)(plVar4 + 0x20);
  }
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_5e8.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5e8.m_name._M_dataplus._M_p != &local_5e8.m_name.field_2) {
    operator_delete(local_5e8.m_name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b0._M_dataplus._M_p != &local_5b0.field_2) {
    operator_delete(local_5b0._M_dataplus._M_p);
  }
  if (local_6b0 != (data *)0x0) {
    (*local_6b8)();
  }
  return (base_learner *)plVar4;
}

Assistant:

LEARNER::base_learner* marginal_setup(options_i& options, vw& all)
{
  free_ptr<MARGINAL::data> d = scoped_calloc_or_throw<MARGINAL::data>();
  std::string marginal;

  option_group_definition marginal_options("VW options");
  marginal_options.add(make_option("marginal", marginal).keep().help("substitute marginal label estimates for ids"));
  marginal_options.add(
      make_option("initial_denominator", d->initial_denominator).default_value(1.f).help("initial denominator"));
  marginal_options.add(
      make_option("initial_numerator", d->initial_numerator).default_value(0.5f).help("initial numerator"));
  marginal_options.add(make_option("compete", d->compete).help("enable competition with marginal features"));
  marginal_options.add(
      make_option("update_before_learn", d->update_before_learn).help("update marginal values before learning"));
  marginal_options.add(make_option("unweighted_marginals", d->unweighted_marginals)
                           .help("ignore importance weights when computing marginals"));
  marginal_options.add(
      make_option("decay", d->decay).default_value(0.f).help("decay multiplier per event (1e-3 for example)"));
  options.add_and_parse(marginal_options);

  if (!options.was_supplied("marginal"))
  {
    return nullptr;
  }

  d->all = &all;

  for (size_t u = 0; u < 256; u++)
    if (marginal.find((char)u) != string::npos)
      d->id_features[u] = true;

  LEARNER::learner<MARGINAL::data, example>& ret =
      init_learner(d, as_singleline(setup_base(options, all)), predict_or_learn<true>, predict_or_learn<false>);
  ret.set_finish(finish);
  ret.set_save_load(save_load);

  return make_base(ret);
}